

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_distinct.cpp
# Opt level: O2

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::LogicalDistinct::ParamsToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,LogicalDistinct *this)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  pointer puVar1;
  pointer puVar2;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pIVar3;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child_00;
  ulong __n;
  allocator local_c1;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c0;
  LogicalDistinct *local_b8;
  string local_b0;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_c0 = __return_storage_ptr__;
  LogicalOperator::ParamsToString_abi_cxx11_(__return_storage_ptr__,&this->super_LogicalOperator);
  puVar1 = (this->distinct_targets).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->distinct_targets).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = this;
  if (puVar1 != puVar2) {
    ::std::__cxx11::string::string((string *)&local_70,anon_var_dwarf_4b0ff16 + 8,&local_c1);
    this_00 = &local_b8->distinct_targets;
    local_90 = local_80;
    local_88 = 0;
    local_80[0] = 0;
    pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(this_00,0);
    const::$_0::operator()::Expression>_true>_const___const(&local_b0,pvVar4,child);
    ::std::__cxx11::string::append((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
    for (__n = 1; __n < (ulong)((long)puVar2 - (long)puVar1 >> 3); __n = __n + 1) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_00,__n);
      const::$_0::operator()::Expression>_true>_const___const(&local_50,pvVar4,child_00);
      ::std::operator+(&local_b0,&local_70,&local_50);
      ::std::__cxx11::string::append((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::string((string *)&local_b0,"Distinct Targets",(allocator *)&local_50);
    this_01 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator[](local_c0,&local_b0);
    ::std::__cxx11::string::operator=((string *)this_01,(string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  pIVar3 = local_c0;
  LogicalOperator::SetParamsEstimatedCardinality(&local_b8->super_LogicalOperator,local_c0);
  return pIVar3;
}

Assistant:

InsertionOrderPreservingMap<string> LogicalDistinct::ParamsToString() const {
	auto result = LogicalOperator::ParamsToString();
	if (!distinct_targets.empty()) {
		result["Distinct Targets"] =
		    StringUtil::Join(distinct_targets, distinct_targets.size(), "\n",
		                     [](const unique_ptr<Expression> &child) { return child->GetName(); });
	}
	SetParamsEstimatedCardinality(result);
	return result;
}